

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall efsw::String::replace(String *this,size_t pos1,size_t n1,char *s,size_t n2)

{
  String tmp;
  String local_48;
  
  String(&local_48,s);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(&this->mString,pos1,n1,local_48.mString._M_dataplus._M_p,n2);
  std::__cxx11::u32string::~u32string((u32string *)&local_48);
  return this;
}

Assistant:

String& String::replace( size_t pos1, size_t n1, const char* s, size_t n2 ) {
	String tmp( s );

	mString.replace( pos1, n1, tmp.data(), n2 );

	return *this;
}